

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_linal_uuT(double *res,double *u,size_t n)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  double *pdVar6;
  double *pdVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  
  if (n != 0) {
    lVar12 = n * 2;
    lVar11 = 0;
    lVar4 = 0;
    sVar5 = 0;
    pdVar6 = u;
    do {
      lVar12 = lVar12 + -2;
      pdVar2 = u + lVar4;
      pdVar7 = pdVar6;
      sVar8 = sVar5;
      lVar10 = lVar11;
      lVar13 = lVar12;
      do {
        res[lVar4] = u[lVar4] * u[((~sVar8 + n * 2) * sVar8 >> 1) + sVar8];
        uVar9 = sVar8 + 1;
        if (uVar9 < n) {
          dVar14 = res[lVar4];
          lVar3 = 1;
          do {
            dVar14 = dVar14 + pdVar2[lVar3] * *(double *)((long)pdVar7 + lVar3 * 8 + lVar10 * 4);
            res[lVar4] = dVar14;
            lVar1 = lVar3 + sVar8;
            lVar3 = lVar3 + 1;
          } while (lVar1 + 1U < n);
        }
        lVar4 = lVar4 + 1;
        pdVar2 = pdVar2 + 1;
        pdVar7 = pdVar7 + 1;
        lVar10 = lVar10 + lVar13;
        lVar13 = lVar13 + -2;
        sVar8 = uVar9;
      } while (uVar9 < n);
      sVar5 = sVar5 + 1;
      pdVar6 = pdVar6 + 1;
      lVar11 = lVar11 + lVar12;
    } while (sVar5 != n);
  }
  return;
}

Assistant:

void fsnav_linal_uuT(double* res, double* u, const size_t n)
{
	size_t i, j, k, p, q, r;

	for (i = 0, k = 0; i < n; i++) {
		for (j = i; j < n; j++, k++) {
			fsnav_linal_u_ij2k(&p, j, j, n);
			res[k] = u[k]*u[p];
			for (q = k+1, p++, r = j+1; r < n; q++, p++, r++)
				res[k] += u[q]*u[p];
		}
	}
}